

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.c
# Opt level: O0

void arena_background_thread_inactivity_check
               (tsdn_t *tsdn,arena_t *arena,_Bool is_background_thread)

{
  byte bVar1;
  uint uVar2;
  decay_t *decay;
  byte in_DL;
  arena_t *in_RSI;
  background_thread_info_t *info;
  uint arena_ind;
  _Bool result_1;
  _Bool result;
  atomic_b_t *npages_new;
  undefined7 in_stack_ffffffffffffffa0;
  
  bVar1 = in_DL & 1;
  npages_new = &duckdb_je_background_thread_enabled_state;
  decay = (decay_t *)0x0;
  if (((duckdb_je_background_thread_enabled_state.repr & 1U) != 0) && (bVar1 == 0)) {
    uVar2 = arena_ind_get(in_RSI);
    if ((*(byte *)((long)&(((arena_t *)
                           (duckdb_je_background_thread_info +
                           (ulong)uVar2 % duckdb_je_max_background_threads))->stats).pa_shard_stats.
                          pac_stats.decay_muzzy.nmadvise.val.repr + 4) & 1) != 0) {
      arena_maybe_do_deferred_work
                ((tsdn_t *)CONCAT17(bVar1,in_stack_ffffffffffffffa0),
                 (arena_t *)
                 (duckdb_je_background_thread_info + (ulong)uVar2 % duckdb_je_max_background_threads
                 ),decay,(size_t)npages_new);
    }
  }
  return;
}

Assistant:

static void
arena_background_thread_inactivity_check(tsdn_t *tsdn, arena_t *arena,
    bool is_background_thread) {
	if (!background_thread_enabled() || is_background_thread) {
		return;
	}
	background_thread_info_t *info =
	    arena_background_thread_info_get(arena);
	if (background_thread_indefinite_sleep(info)) {
		arena_maybe_do_deferred_work(tsdn, arena,
		    &arena->pa_shard.pac.decay_dirty, 0);
	}
}